

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

bool __thiscall toml::internal::Parser::parseKeyValue(Parser *this,Value *current)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Value *pVVar3;
  Value v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  Value local_28;
  
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if ((this->token_).type_ - IDENT < 2) {
    std::__cxx11::string::_M_assign((string *)&local_48);
    nextValue(this);
    if ((this->token_).type_ == EQUAL) {
      nextValue(this);
      local_28.type_ = NULL_TYPE;
      local_28.field_1.null_ = (void *)0x0;
      bVar2 = parseValue(this,&local_28);
      if ((bVar2) && ((this->token_).type_ - END_OF_FILE < 2)) {
        nextKey(this);
        pVVar3 = Value::find(current,&local_48);
        if (pVVar3 != (Value *)0x0) {
          std::operator+(&local_68,"Multiple same key: ",&local_48);
          addError(this,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0015a52c;
        }
        bVar2 = true;
        Value::setChild(current,&local_48,&local_28);
      }
      else {
LAB_0015a52c:
        bVar2 = false;
      }
      Value::~Value(&local_28);
      goto LAB_0015a5a8;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"no equal?","");
    addError(this,&local_68);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"parse key failed","");
    addError(this,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0015a5a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

inline bool Parser::parseKeyValue(Value* current)
{
    std::string key;
    if (!parseKey(&key)) {
        addError("parse key failed");
        return false;
    }
    if (!consumeForValue(TokenType::EQUAL)) {
        addError("no equal?");
        return false;
    }

    Value v;
    if (!parseValue(&v))
        return false;
    if (!consumeEOLorEOFForKey())
        return false;

    if (current->has(key)) {
        addError("Multiple same key: " + key);
        return false;
    }

    current->setChild(key, std::move(v));
    return true;
}